

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_io_exception.cpp
# Opt level: O0

char * __thiscall argo::json_io_exception::get_main_message(json_io_exception *this)

{
  json_io_exception *this_local;
  
  switch((this->super_json_exception).m_type) {
  case fgetc_failed_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c394;
    break;
  case read_failed_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c3b7;
    break;
  case unexpected_result_from_read_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c3cd;
    break;
  case write_fd_failed_e:
    this_local = (json_io_exception *)0x1294d4;
    break;
  case write_file_failed_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c3ed;
    break;
  case too_many_put_back_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c403;
    break;
  case file_open_failed_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c42f;
    break;
  default:
    this_local = (json_io_exception *)anon_var_dwarf_eb20;
    break;
  case message_too_long_e:
    this_local = (json_io_exception *)anon_var_dwarf_1c419;
  }
  return (char *)this_local;
}

Assistant:

const char *json_io_exception::get_main_message()
{
    switch (m_type)
    {
    case fgetc_failed_e:
        return "fgetc() failed";
    case read_failed_e:
        return "read() failed";
    case unexpected_result_from_read_e:
        return "unexpected result from read()";
    case write_fd_failed_e:
        return "write() failed";
    case write_file_failed_e:
        return "fwrite() failed";
    case too_many_put_back_e:
        return "internal error, too many characters put back into a reader";
    case message_too_long_e:
        return "maximum configured message length exceeded";
    case file_open_failed_e:
        return "file open failed";
    default:
        return "generic";
    }
}